

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O3

bool GetUniquePathFromEnv(char *env_name,char *path)

{
  __pid_t _Var1;
  byte *pbVar2;
  char *pcVar3;
  byte *pbVar4;
  byte bVar5;
  bool bVar6;
  char local_138 [8];
  char forceVarName [256];
  
  pbVar2 = (byte *)getenv(env_name);
  if ((pbVar2 == (byte *)0x0) || (*pbVar2 == 0)) {
    return false;
  }
  pcVar3 = getenv("PMIX_RANK");
  if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) {
    pcVar3 = getenv("SLURM_JOB_ID");
    if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) {
      pcVar3 = getenv("OMPI_HOME");
      if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) goto LAB_0010f745;
      pcVar3 = getenv("PMI_RANK");
      if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) goto LAB_0010f647;
      pcVar3 = "";
      forceVarName._248_8_ = (long)"%s from %s (%s ms total)\n\n" + 0x1a;
      goto LAB_0010f652;
    }
    pcVar3 = getenv("SLURM_PROCID");
    if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) {
      forceVarName._248_8_ = ".slurmid-";
      goto LAB_0010f652;
    }
LAB_0010f745:
    snprintf(local_138,0x100,"%s_USE_PID",env_name);
    pcVar3 = "";
    forceVarName._248_8_ = (long)"%s from %s (%s ms total)\n\n" + 0x1a;
LAB_0010f76d:
    bVar6 = -1 < (char)*pbVar2;
    *pbVar2 = *pbVar2 & 0x7f;
    bVar5 = 1;
  }
  else {
LAB_0010f647:
    forceVarName._248_8_ = ".rank-";
LAB_0010f652:
    snprintf(local_138,0x100,"%s_USE_PID",env_name);
    pbVar4 = (byte *)getenv(local_138);
    if (pbVar4 != (byte *)0x0) {
      bVar5 = *pbVar4;
      if ((((bVar5 - 0x54 < 0x26) && ((0x2100000021U >> ((ulong)(bVar5 - 0x54) & 0x3f) & 1) != 0))
          || (bVar5 == 0)) || (bVar5 == 0x31)) goto LAB_0010f76d;
    }
    bVar5 = *pbVar2;
    *pbVar2 = bVar5 & 0x7f;
    bVar6 = -1 < (char)bVar5;
    if (bVar6) {
      snprintf(path,0x1000,"%s%s%s",pbVar2,forceVarName._248_8_,pcVar3);
      goto LAB_0010f7a9;
    }
    bVar5 = 0;
  }
  _Var1 = getpid();
  snprintf(path,0x1000,"%s%s%s_%d",pbVar2,forceVarName._248_8_,pcVar3,_Var1);
  if ((bool)(bVar5 & bVar6)) {
    return true;
  }
LAB_0010f7a9:
  *pbVar2 = *pbVar2 | 0x80;
  return true;
}

Assistant:

bool GetUniquePathFromEnv(const char* env_name, char* path) {
  char* envval = getenv(env_name);

  if (envval == nullptr || *envval == '\0') {
    return false;
  }

  const char* append1 = "";
  const char* append2 = "";
  bool pidIsForced;
  std::tie(pidIsForced, append1, append2) = QueryHPCEnvironment();

  // Generate the "forcing" environment variable name in a form of
  // <ORIG_ENVAR>_USE_PID that requests PID to be used in the file names
  char forceVarName[256];
  snprintf(forceVarName, sizeof(forceVarName), "%s_USE_PID", env_name);

  pidIsForced = pidIsForced || EnvToBool(forceVarName, false);

  // Get information about the child bit and drop it
  const bool childBitDetected = (*envval & 128) != 0;
  *envval &= ~128;

  if (pidIsForced || childBitDetected) {
    snprintf(path, PATH_MAX, "%s%s%s_%d",
             envval, append1, append2, GetPID());
  } else {
    snprintf(path, PATH_MAX, "%s%s%s", envval, append1, append2);
  }

  // Set the child bit for the fork'd processes, unless appending pid
  // was forced by either _USE_PID thingy or via MPI detection stuff.
  if (childBitDetected || !pidIsForced) {
    *envval |= 128;
  }
  return true;
}